

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DisposeBottomPt(Clipper *this,OutRec *outRec)

{
  OutPt *pOVar1;
  OutPt *pOVar2;
  OutPt *prev;
  OutPt *next;
  OutRec *outRec_local;
  Clipper *this_local;
  
  pOVar1 = outRec->bottomPt->next;
  pOVar2 = outRec->bottomPt->prev;
  if (outRec->pts == outRec->bottomPt) {
    outRec->pts = pOVar1;
  }
  if (outRec->bottomPt != (OutPt *)0x0) {
    operator_delete(outRec->bottomPt,0x28);
  }
  pOVar1->prev = pOVar2;
  pOVar2->next = pOVar1;
  outRec->bottomPt = pOVar1;
  FixupOutPolygon(this,outRec);
  return;
}

Assistant:

void Clipper::DisposeBottomPt(OutRec &outRec)
{
  OutPt* next = outRec.bottomPt->next;
  OutPt* prev = outRec.bottomPt->prev;
  if (outRec.pts == outRec.bottomPt) outRec.pts = next;
  delete outRec.bottomPt;
  next->prev = prev;
  prev->next = next;
  outRec.bottomPt = next;
  FixupOutPolygon(outRec);
}